

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qitemselectionmodel.cpp
# Opt level: O0

void QItemSelectionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  QMetaType QVar3;
  QAbstractItemModel *pQVar4;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QBindable<QAbstractItemModel_*> QVar5;
  void *_v_1;
  void *_v;
  bool _r_8;
  bool _r_7;
  bool _r_6;
  bool _r_5;
  bool _r_4;
  bool _r_3;
  bool _r_2;
  bool _r_1;
  bool _r;
  QItemSelectionModel *_t;
  QModelIndexList _r_12;
  QModelIndexList _r_11;
  QModelIndexList _r_10;
  QModelIndexList _r_9;
  QModelIndex *in_stack_fffffffffffffda8;
  QList<QModelIndex> *in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  QItemSelectionModel *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  QItemSelectionModel *in_stack_fffffffffffffdf0;
  QItemSelectionModel *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe10;
  int row;
  undefined8 *puVar6;
  QItemSelectionModel *in_stack_fffffffffffffe18;
  QModelIndex *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  QItemSelectionModel *in_stack_fffffffffffffe40;
  QUntypedPropertyData *local_168;
  QBindableInterface *local_160;
  QModelIndex *in_stack_fffffffffffffed0;
  undefined4 local_128;
  int in_stack_fffffffffffffedc;
  QItemSelectionModel *in_stack_fffffffffffffee0;
  undefined8 local_118;
  QMetaType local_108;
  QMetaTypeInterface *local_100;
  QMetaType local_f8;
  QMetaTypeInterface *local_f0;
  QMetaType local_e8;
  QMetaType local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffe00 = (QItemSelectionModel *)(ulong)in_EDX;
    row = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    switch(in_stack_fffffffffffffe00) {
    case (QItemSelectionModel *)0x0:
      selectionChanged((QItemSelectionModel *)in_stack_fffffffffffffdb0,
                       (QItemSelection *)in_stack_fffffffffffffda8,(QItemSelection *)0x830489);
      break;
    case (QItemSelectionModel *)0x1:
      currentChanged((QItemSelectionModel *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (QModelIndex *)0x8304b3);
      break;
    case (QItemSelectionModel *)0x2:
      currentRowChanged((QItemSelectionModel *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        (QModelIndex *)0x8304dd);
      break;
    case (QItemSelectionModel *)0x3:
      currentColumnChanged
                ((QItemSelectionModel *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 (QModelIndex *)0x830507);
      break;
    case (QItemSelectionModel *)0x4:
      modelChanged((QItemSelectionModel *)0x830528,(QAbstractItemModel *)in_stack_fffffffffffffda8);
      break;
    case (QItemSelectionModel *)0x5:
      local_c = **(undefined4 **)(in_RCX + 0x10);
      (**(code **)(*in_RDI + 0x60))(in_RDI,*(undefined8 *)(in_RCX + 8),local_c);
      break;
    case (QItemSelectionModel *)0x6:
      local_10 = **(undefined4 **)(in_RCX + 0x10);
      (**(code **)(*in_RDI + 0x68))(in_RDI,*(undefined8 *)(in_RCX + 8),local_10);
      break;
    case (QItemSelectionModel *)0x7:
      local_14 = **(undefined4 **)(in_RCX + 0x10);
      (**(code **)(*in_RDI + 0x70))(in_RDI,*(undefined8 *)(in_RCX + 8),local_14);
      break;
    case (QItemSelectionModel *)0x8:
      (**(code **)(*in_RDI + 0x78))();
      break;
    case (QItemSelectionModel *)0x9:
      (**(code **)(*in_RDI + 0x80))();
      break;
    case (QItemSelectionModel *)0xa:
      clearSelection(in_stack_fffffffffffffdd0);
      break;
    case (QItemSelectionModel *)0xb:
      (**(code **)(*in_RDI + 0x88))();
      break;
    case (QItemSelectionModel *)0xc:
      bVar1 = isSelected(in_stack_fffffffffffffdf0,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0xd:
      bVar1 = isRowSelected(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                            in_stack_fffffffffffffed0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0xe:
      QModelIndex::QModelIndex((QModelIndex *)0x830701);
      bVar1 = isRowSelected(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                            in_stack_fffffffffffffed0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0xf:
      bVar1 = isColumnSelected(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                               in_stack_fffffffffffffed0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0x10:
      QModelIndex::QModelIndex((QModelIndex *)0x8307d0);
      bVar1 = isColumnSelected(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                               in_stack_fffffffffffffed0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0x11:
      bVar1 = rowIntersectsSelection(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0x12:
      in_stack_fffffffffffffddc = **(undefined4 **)(in_RCX + 8);
      QModelIndex::QModelIndex((QModelIndex *)0x83089f);
      bVar1 = rowIntersectsSelection(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0x13:
      bVar1 = columnIntersectsSelection(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0x14:
      QModelIndex::QModelIndex((QModelIndex *)0x83096e);
      bVar1 = columnIntersectsSelection(in_stack_fffffffffffffe40,iVar2,in_stack_fffffffffffffe30);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QItemSelectionModel *)0x15:
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      selectedRows(in_stack_fffffffffffffe18,row);
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  (in_stack_fffffffffffffdb0,(QList<QModelIndex> *)in_stack_fffffffffffffda8);
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x830a3a);
      break;
    case (QItemSelectionModel *)0x16:
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      selectedRows(in_stack_fffffffffffffe18,row);
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  (in_stack_fffffffffffffdb0,(QList<QModelIndex> *)in_stack_fffffffffffffda8);
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x830ab6);
      break;
    case (QItemSelectionModel *)0x17:
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      selectedColumns(in_stack_fffffffffffffe18,row);
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  (in_stack_fffffffffffffdb0,(QList<QModelIndex> *)in_stack_fffffffffffffda8);
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x830b3e);
      break;
    case (QItemSelectionModel *)0x18:
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      selectedColumns(in_stack_fffffffffffffe18,row);
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  (in_stack_fffffffffffffdb0,(QList<QModelIndex> *)in_stack_fffffffffffffda8);
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x830bb7);
    }
  }
  if (in_ESI == 7) {
    in_stack_fffffffffffffdbc = in_EDX;
    if (in_EDX == 0) {
      if (**(uint **)(in_RCX + 8) < 2) {
        local_f0 = (QMetaTypeInterface *)QMetaType::fromType<QItemSelection>();
        **(undefined8 **)in_RCX = local_f0;
      }
      else {
        memset(&local_e8,0,8);
        QMetaType::QMetaType(&local_e8);
        **(undefined8 **)in_RCX = local_e8.d_ptr;
      }
    }
    else if (in_EDX == 4) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_100 = (QMetaTypeInterface *)QMetaType::fromType<QAbstractItemModel*>();
        **(undefined8 **)in_RCX = local_100;
      }
      else {
        memset(&local_f8,0,8);
        QMetaType::QMetaType(&local_f8);
        **(undefined8 **)in_RCX = local_f8.d_ptr;
      }
    }
    else if (in_EDX == 7) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar3 = QMetaType::fromType<QItemSelection>();
        **(undefined8 **)in_RCX = QVar3.d_ptr;
      }
      else {
        memset(&local_108,0,8);
        QMetaType::QMetaType(&local_108);
        **(undefined8 **)in_RCX = local_108.d_ptr;
      }
    }
    else {
      memset(&local_e0,0,8);
      QMetaType::QMetaType(&local_e0);
      **(undefined8 **)in_RCX = local_e0.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar1 = QtMocHelpers::
                 indexOfMethod<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&)>
                           (in_RCX,(void **)selectionChanged,0,0), !bVar1 &&
        (bVar1 = QtMocHelpers::
                 indexOfMethod<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&)>
                           (in_RCX,(void **)currentChanged,0,1), !bVar1)) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&)>
                          (in_RCX,(void **)currentRowChanged,0,2), !bVar1)) &&
      ((bVar1 = QtMocHelpers::
                indexOfMethod<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&)>
                          (in_RCX,(void **)currentColumnChanged,0,3), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QItemSelectionModel::*)(QAbstractItemModel*)>
                          (in_RCX,(void **)modelChanged,0,4), !bVar1)))))) {
    if (in_ESI == 6) {
      in_stack_fffffffffffffdb8 = in_EDX;
      if (in_EDX == 0) {
        iVar2 = qRegisterMetaType<QAbstractItemModel*>();
        **(int **)in_RCX = iVar2;
      }
      else if (in_EDX == 3) {
        iVar2 = qRegisterMetaType<QItemSelection>();
        **(int **)in_RCX = iVar2;
      }
      else if (in_EDX == 4) {
        iVar2 = qRegisterMetaType<QList<QModelIndex>>();
        **(int **)in_RCX = iVar2;
      }
      else {
        **(undefined4 **)in_RCX = 0xffffffff;
      }
    }
    if (in_ESI == 1) {
      puVar6 = *(undefined8 **)in_RCX;
      in_stack_fffffffffffffdb0 = (QList<QModelIndex> *)(ulong)in_EDX;
      switch(in_stack_fffffffffffffdb0) {
      case (QList<QModelIndex> *)0x0:
        pQVar4 = model((QItemSelectionModel *)0x830fd8);
        *puVar6 = pQVar4;
        break;
      case (QList<QModelIndex> *)0x1:
        bVar1 = hasSelection(in_stack_fffffffffffffe00);
        *(bool *)puVar6 = bVar1;
        break;
      case (QList<QModelIndex> *)0x2:
        currentIndex((QItemSelectionModel *)in_stack_fffffffffffffdb0);
        *puVar6 = CONCAT44(in_stack_fffffffffffffedc,local_128);
        puVar6[1] = in_stack_fffffffffffffee0;
        puVar6[2] = local_118;
        break;
      case (QList<QModelIndex> *)0x3:
        selection((QItemSelectionModel *)
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        QItemSelection::operator=
                  ((QItemSelection *)in_stack_fffffffffffffdb0,
                   (QItemSelection *)in_stack_fffffffffffffda8);
        QItemSelection::~QItemSelection((QItemSelection *)0x831079);
        break;
      case (QList<QModelIndex> *)0x4:
        selectedIndexes((QItemSelectionModel *)
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        QList<QModelIndex>::operator=
                  (in_stack_fffffffffffffdb0,(QList<QModelIndex> *)in_stack_fffffffffffffda8);
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8310af);
      }
    }
    if ((in_ESI == 2) && (in_EDX == 0)) {
      setModel((QItemSelectionModel *)in_stack_fffffffffffffdb0,
               (QAbstractItemModel *)in_stack_fffffffffffffda8);
    }
    if ((in_ESI == 8) && (in_EDX == 0)) {
      QVar5 = bindableModel((QItemSelectionModel *)
                            CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      puVar6 = *(undefined8 **)in_RCX;
      local_168 = QVar5.super_QUntypedBindable.data;
      *puVar6 = local_168;
      local_160 = QVar5.super_QUntypedBindable.iface;
      puVar6[1] = local_160;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QItemSelectionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 1: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 3: _t->currentColumnChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 4: _t->modelChanged((*reinterpret_cast< std::add_pointer_t<QAbstractItemModel*>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 6: _t->select((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 7: _t->select((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 8: _t->clear(); break;
        case 9: _t->reset(); break;
        case 10: _t->clearSelection(); break;
        case 11: _t->clearCurrentIndex(); break;
        case 12: { bool _r = _t->isSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 14: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 15: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 16: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 17: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 18: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 19: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 20: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: { QModelIndexList _r = _t->selectedRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 22: { QModelIndexList _r = _t->selectedRows();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 23: { QModelIndexList _r = _t->selectedColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 24: { QModelIndexList _r = _t->selectedColumns();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractItemModel* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QItemSelection & , const QItemSelection & )>(_a, &QItemSelectionModel::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentRowChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentColumnChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(QAbstractItemModel * )>(_a, &QItemSelectionModel::modelChanged, 4))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractItemModel* >(); break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QItemSelection >(); break;
        case 4:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QModelIndexList >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractItemModel**>(_v) = _t->model(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasSelection(); break;
        case 2: *reinterpret_cast<QModelIndex*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<QItemSelection*>(_v) = _t->selection(); break;
        case 4: *reinterpret_cast<QModelIndexList*>(_v) = _t->selectedIndexes(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setModel(*reinterpret_cast<QAbstractItemModel**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableModel(); break;
        default: break;
        }
    }
}